

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

int anon_unknown.dwarf_16549e0::ConvolveScaleTestBase<unsigned_short>::RandomSubpel(ACMRandom *rnd)

{
  byte bVar1;
  ACMRandom *in_RDI;
  uint8_t subpel_mode;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  bVar1 = libaom_test::ACMRandom::Rand8(in_RDI);
  if ((bVar1 & 7) == 0) {
    local_4 = 0;
  }
  else if ((bVar1 & 7) == 1) {
    local_4 = 0x3ff;
  }
  else {
    local_4 = libaom_test::ACMRandom::PseudoUniform
                        (in_RDI,CONCAT13(bVar1,(int3)in_stack_ffffffffffffffec));
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

static int RandomSubpel(ACMRandom *rnd) {
    const uint8_t subpel_mode = rnd->Rand8();
    if ((subpel_mode & 7) == 0) {
      return 0;
    } else if ((subpel_mode & 7) == 1) {
      return SCALE_SUBPEL_SHIFTS - 1;
    } else {
      return 1 + rnd->PseudoUniform(SCALE_SUBPEL_SHIFTS - 2);
    }
  }